

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

float vera::remap(float *_value,float *_inputMin,float *_inputMax,float *_outputMin,
                 float *_outputMax,bool _clamp)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  float fVar4;
  
  fVar4 = *_inputMin;
  if (ABS(fVar4 - *_inputMax) < 1.1920929e-07) {
    return *_outputMin;
  }
  fVar1 = *_outputMax;
  fVar2 = *_outputMin;
  fVar4 = (fVar1 - fVar2) * ((*_value - fVar4) / (*_inputMax - fVar4)) + fVar2;
  if (_clamp) {
    if (fVar2 <= fVar1) {
      if (fVar1 < fVar4) {
        return fVar1;
      }
      bVar3 = fVar2 < fVar4;
    }
    else {
      if (fVar4 < fVar1) {
        return fVar1;
      }
      bVar3 = fVar4 < fVar2;
    }
    if (!bVar3 && fVar4 != fVar2) {
      fVar4 = fVar2;
    }
    return fVar4;
  }
  return fVar4;
}

Assistant:

inline float remap(const float& _value, const float& _inputMin, const float& _inputMax, const float& _outputMin, const float& _outputMax, bool _clamp) {
    if (fabs(_inputMin - _inputMax) < std::numeric_limits<float>::epsilon()) { return _outputMin; } else {
        float outVal = ((_value - _inputMin) / (_inputMax - _inputMin) * (_outputMax - _outputMin) + _outputMin);

        if (_clamp) {
            if (_outputMax < _outputMin) {
                if (outVal < _outputMax) {
                    outVal = _outputMax;
                } else if (outVal > _outputMin) {
                    outVal = _outputMin;
                }
            } else {
                if (outVal > _outputMax) {
                    outVal = _outputMax;
                } else if (outVal < _outputMin) {
                    outVal = _outputMin;
                }
            }
        }
        return outVal;
    }
}